

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2c8643::Node::dump(Node *this)

{
  OutputStream S;
  OutputStream local_30;
  
  local_30.Buffer = (char *)malloc(0x400);
  local_30.CurrentPosition = 0;
  local_30.BufferCapacity = 0x400;
  local_30.CurrentPackIndex = 0xffffffff;
  local_30.CurrentPackMax = 0xffffffff;
  print(this,&local_30);
  OutputStream::operator+=(&local_30,'\0');
  printf("Symbol dump for %p: %s\n",this,local_30.Buffer);
  free(local_30.Buffer);
  return;
}

Assistant:

LLVM_DUMP_METHOD void dump() const {
    char *Buffer = static_cast<char*>(std::malloc(1024));
    OutputStream S(Buffer, 1024);
    print(S);
    S += '\0';
    printf("Symbol dump for %p: %s\n", (const void*)this, S.getBuffer());
    std::free(S.getBuffer());
  }